

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O3

void __thiscall MockNamedValueList::add(MockNamedValueList *this,MockNamedValue *newValue)

{
  MockNamedValueListNode *pMVar1;
  MockNamedValueList MVar2;
  MockNamedValueListNode *pMVar3;
  
  MVar2.head_ = (MockNamedValueListNode *)
                operator_new(0x10,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                             ,0x242);
  (MVar2.head_)->data_ = newValue;
  (MVar2.head_)->next_ = (MockNamedValueListNode *)0x0;
  pMVar1 = this->head_;
  if (this->head_ != (MockNamedValueListNode *)0x0) {
    do {
      pMVar3 = pMVar1;
      pMVar1 = pMVar3->next_;
    } while (pMVar1 != (MockNamedValueListNode *)0x0);
    this = (MockNamedValueList *)&pMVar3->next_;
  }
  *this = (MockNamedValueList)MVar2.head_;
  return;
}

Assistant:

void MockNamedValueList::add(MockNamedValue* newValue)
{
    MockNamedValueListNode* newNode = new MockNamedValueListNode(newValue);
    if (head_ == NULLPTR)
        head_ = newNode;
    else {
        MockNamedValueListNode* lastNode = head_;
        while (lastNode->next()) lastNode = lastNode->next();
        lastNode->setNext(newNode);
    }
}